

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnRetime.c
# Opt level: O1

void Wln_NtkRetimeCreateDelayInfo(Wln_Ntk_t *pNtk)

{
  uint uVar1;
  int iVar2;
  Wln_Vec_t *pWVar3;
  int *piVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *paVar8;
  char *__s;
  
  if ((pNtk->vInstIds).nSize < 1) {
    puts("The design has no delay information.");
    uVar1 = (pNtk->vTypes).nCap;
    if ((pNtk->vInstIds).nCap < (int)uVar1) {
      piVar4 = (pNtk->vInstIds).pArray;
      if (piVar4 == (int *)0x0) {
        piVar4 = (int *)malloc((long)(int)uVar1 << 2);
      }
      else {
        piVar4 = (int *)realloc(piVar4,(long)(int)uVar1 << 2);
      }
      (pNtk->vInstIds).pArray = piVar4;
      if (piVar4 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x215,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pNtk->vInstIds).nCap = uVar1;
    }
    if (0 < (int)uVar1) {
      memset((pNtk->vInstIds).pArray,0,(ulong)uVar1 * 4);
    }
    (pNtk->vInstIds).nSize = uVar1;
    if (1 < (pNtk->vTypes).nSize) {
      piVar4 = (pNtk->vTypes).pArray;
      lVar5 = 1;
      lVar6 = 0x14;
      do {
        iVar2 = piVar4[lVar5];
        uVar1 = iVar2 - 0x59;
        if ((uVar1 < 4) && (uVar1 != 1)) {
          iVar2 = (pNtk->vInstIds).nSize;
          iVar7 = 1;
LAB_00364b26:
          if (iVar2 <= lVar5) goto LAB_00364c1e;
          (pNtk->vInstIds).pArray[lVar5] = iVar7;
        }
        else if ((iVar2 - 5U < 0xfffffffe) && (0 < *(int *)((long)&pNtk->vFanins->nCap + lVar6))) {
          iVar2 = (pNtk->vInstIds).nSize;
          iVar7 = 10;
          goto LAB_00364b26;
        }
        lVar5 = lVar5 + 1;
        lVar6 = lVar6 + 0x10;
      } while (lVar5 < (pNtk->vTypes).nSize);
    }
    __s = 
    "Assuming default delays: 10 units for most nodes and 1 unit for bit-slice, concat, and buffers driving COs."
    ;
    if (0 < (pNtk->vCos).nSize) {
      piVar4 = (pNtk->vCos).pArray;
      pWVar3 = pNtk->vFanins;
      lVar5 = 0;
      do {
        iVar2 = piVar4[lVar5];
        paVar8 = &pWVar3[iVar2].field_2;
        if (2 < pWVar3[iVar2].nSize) {
          paVar8 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar8->pArray[0];
        }
        iVar7 = paVar8->Array[0];
        if (((long)iVar7 < 0) || ((pNtk->vTypes).nSize <= iVar7)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        if ((pNtk->vTypes).pArray[iVar7] != 0x4b) {
          paVar8 = &pWVar3[iVar2].field_2;
          if (2 < pWVar3[iVar2].nSize) {
            paVar8 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar8->pArray[0];
          }
          iVar2 = paVar8->Array[0];
          if (((long)iVar2 < 0) || ((pNtk->vInstIds).nSize <= iVar2)) {
LAB_00364c1e:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                          ,0x1c9,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          (pNtk->vInstIds).pArray[iVar2] = 1;
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < (pNtk->vCos).nSize);
    }
  }
  else {
    __s = "Using delays given by the user in the input file.";
  }
  puts(__s);
  return;
}

Assistant:

void Wln_NtkRetimeCreateDelayInfo( Wln_Ntk_t * pNtk )
{
//    if ( Wln_NtkHasInstId(pNtk) )
//        Vec_IntErase( &pNtk->vInstIds );
    if ( Wln_NtkHasInstId(pNtk) )
        printf( "Using delays given by the user in the input file.\n" );
    else
    {
        int i, iObj;
        printf( "The design has no delay information.\n" );
        Wln_NtkCleanInstId(pNtk);
        Wln_NtkForEachObj( pNtk, iObj )
        {
            if ( Wln_ObjIsFf(pNtk, iObj) || Wln_ObjType(pNtk, iObj) == ABC_OPER_SLICE || Wln_ObjType(pNtk, iObj) == ABC_OPER_CONCAT )
                Wln_ObjSetInstId( pNtk, iObj, 1 );
            else if ( !Wln_ObjIsCio(pNtk, iObj) && Wln_ObjFaninNum(pNtk, iObj) > 0 )
                Wln_ObjSetInstId( pNtk, iObj, 10 );
        }
        Wln_NtkForEachCo( pNtk, iObj, i ) 
        {
            if ( Wln_ObjType(pNtk, Wln_ObjFanin0(pNtk, iObj)) != ABC_OPER_LUT )
                Wln_ObjSetInstId( pNtk, Wln_ObjFanin0(pNtk, iObj), 1 );
        }
        printf( "Assuming default delays: 10 units for most nodes and 1 unit for bit-slice, concat, and buffers driving COs.\n" );
    }
}